

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O0

void bits::detail::
     RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
     radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
               (long param_1,long param_2,long param_3,long param_4,uint param_5,long param_6,
               uint param_7)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t index;
  uint pos;
  uint key;
  uint32_t i;
  uint local_3c;
  PassThrough local_2;
  PassThrough local_1;
  
  for (local_3c = 0; local_3c < param_5; local_3c = local_3c + 1) {
    uVar2 = PassThrough::operator()(&local_1,*(uint *)(param_1 + (ulong)local_3c * 4));
    uVar3 = (ulong)(uVar2 >> ((byte)key & 0x1f) & 0x7ff);
    uVar1 = *(uint *)(param_6 + uVar3 * 4);
    *(uint *)(param_6 + uVar3 * 4) = uVar1 + 1;
    uVar2 = PassThrough::operator()(&local_2,uVar2);
    *(uint *)(param_2 + (ulong)uVar1 * 4) = uVar2;
    *(undefined4 *)(param_4 + (ulong)uVar1 * 4) = *(undefined4 *)(param_3 + (ulong)local_3c * 4);
  }
  return;
}

Assistant:

static inline void radix_pass(const KeyType* __restrict keys_in, KeyType* __restrict keys_out,
        const ValueType* __restrict values_in, ValueType* __restrict values_out, uint32_t size,
        uint32_t* __restrict hist, KeyType shift, PassDecodeOp decode_op, PassEncodeOp encode_op)
    {
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            const KeyType pos = (key >> shift) & kHistMask;
            const uint32_t index = hist[pos]++;
            keys_out[index] = encode_op(key);
            values_out[index] = values_in[i];
        }
    }